

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

size_t __thiscall Apt::GetSimilarTaxiNode(Apt *this,double _lat,double _lon,size_t dontCombineWith)

{
  pointer pTVar1;
  size_t sVar2;
  pointer pTVar3;
  pointer pTVar4;
  const_iterator iter;
  pointer pTVar5;
  double dVar6;
  double dVar7;
  double local_48;
  
  dVar6 = cos(((double)(~-(ulong)(_lat <= 180.0) & (ulong)(_lat + -360.0) |
                       -(ulong)(_lat <= 180.0) & (ulong)_lat) * 3.141592653589793) / 180.0);
  pTVar5 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = pTVar5 + dontCombineWith;
  if (dontCombineWith == 0xffffffffffffffff) {
    pTVar3 = pTVar1;
  }
  local_48 = INFINITY;
  pTVar4 = pTVar1;
  for (; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    if (pTVar5 != pTVar3) {
      if (ABS(pTVar5->lat - _lat) < 1.7996462795237596e-05) {
        if (ABS(pTVar5->lon - _lon) < 2.0 / (dVar6 * 111132.95)) {
          dVar7 = DistLatLonSqr(_lat,_lon,pTVar5->lat,pTVar5->lon);
          if (dVar7 < local_48) {
            pTVar4 = pTVar5;
            local_48 = dVar7;
          }
        }
      }
    }
    pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  sVar2 = 0xffffffffffffffff;
  if (pTVar4 != pTVar1) {
    sVar2 = (long)pTVar4 -
            (long)(this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 6;
  }
  return sVar2;
}

Assistant:

size_t GetSimilarTaxiNode (double _lat, double _lon,
                               size_t dontCombineWith = ULONG_MAX) const
    {
        constexpr double latDiff = Dist2Lat(APT_MAX_SIMILAR_NODE_DIST_M);
        const     double lonDiff = Dist2Lon(APT_MAX_SIMILAR_NODE_DIST_M, _lat);
        
        double bestDist2 = HUGE_VAL;
        const vecTaxiNodesTy::const_iterator dontIter =
        dontCombineWith == ULONG_MAX ? vecTaxiNodes.cend() :
                                       std::next(vecTaxiNodes.cbegin(),(long)dontCombineWith);
        vecTaxiNodesTy::const_iterator bestIter = vecTaxiNodes.cend();
        for (auto iter = vecTaxiNodes.cbegin(); iter != vecTaxiNodes.cend(); ++iter)
        {
            // quick check: reasonable lat/lon range
            if (iter != dontIter &&         // not the one node to skip
                std::abs(iter->lat - _lat) < latDiff &&
                std::abs(iter->lon - _lon) < lonDiff)
            {
                // find shortest distance
                const double dist2 = DistLatLonSqr(_lat, _lon, iter->lat, iter->lon);
                if (dist2 < bestDist2) {
                    bestDist2 = dist2;
                    bestIter = iter;
                }
            }
        }
        
        // Found something?
        return (bestIter != vecTaxiNodes.cend() ?
                (size_t)std::distance(vecTaxiNodes.cbegin(), bestIter) :
                ULONG_MAX);
    }